

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relax_float_ops_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::RelaxFloatOpsPass::ProcessFunction(RelaxFloatOpsPass *this,Function *func)

{
  CFG *this_00;
  bool modified;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  modified = false;
  this_00 = Pass::cfg(&this->super_Pass);
  local_20 = std::
             _Function_handler<void_(spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/relax_float_ops_pass.cpp:70:28)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(spvtools::opt::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/relax_float_ops_pass.cpp:70:28)>
             ::_M_manager;
  local_38._M_unused._M_object = &modified;
  local_38._8_8_ = this;
  CFG::ForEachBlockInReversePostOrder
            (this_00,(BasicBlock *)
                     (((func->blocks_).
                       super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                     super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                     ._M_t,(function<void_(spvtools::opt::BasicBlock_*)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return modified;
}

Assistant:

bool RelaxFloatOpsPass::ProcessFunction(Function* func) {
  bool modified = false;
  cfg()->ForEachBlockInReversePostOrder(
      func->entry().get(), [&modified, this](BasicBlock* bb) {
        for (auto ii = bb->begin(); ii != bb->end(); ++ii)
          modified |= ProcessInst(&*ii);
      });
  return modified;
}